

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imath.hpp
# Opt level: O2

long primesum::iroot<3,long>(long x)

{
  long lVar1;
  long lVar2;
  long lVar3;
  double dVar4;
  
  dVar4 = pow((double)x,0.3333333333333333);
  for (lVar3 = (long)dVar4; 0 < lVar3; lVar3 = lVar3 + -1) {
    lVar1 = ipow<long>(lVar3,2);
    if (lVar1 <= x / lVar3) break;
  }
  lVar3 = lVar3 + -1;
  do {
    lVar1 = lVar3 + 2;
    lVar2 = ipow<long>(lVar1,2);
    lVar3 = lVar3 + 1;
  } while (lVar2 <= x / lVar1);
  return lVar3;
}

Assistant:

inline T iroot(T x)
{
  if (N == 0)
    return 0;

  T r = (T) std::pow((double) x, 1.0 / N);

  // fix root too large
  for (; r > 0; r--)
  {
    if (ipow(r, N - 1) <= x / r)
      break;
  }

  // fix root too small
  while (ipow(r + 1, N - 1) <= x / (r + 1))
    r += 1;

  return r;
}